

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::object::write_full_size<std::wostream,pstore::dump::object_wchar_traits>
          (object *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind,
          object_strings<pstore::dump::object_wchar_traits> *strings)

{
  pointer pmVar1;
  unsigned_long uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  wostream *pwVar5;
  undefined4 extraout_var;
  wstring *pwVar6;
  byte bVar7;
  uint uVar8;
  pointer ptVar9;
  pointer p;
  indent next_indent;
  string_type sep;
  size_t key_length;
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  kvps;
  uint local_dc;
  wchar_t *local_d8;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *local_d0;
  undefined1 local_c8 [32];
  wchar_t *local_a8;
  long local_a0;
  long local_98 [2];
  indent *local_88;
  object_strings<pstore::dump::object_wchar_traits> *local_80;
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  local_78;
  pointer local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_78.
  super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = os;
  local_88 = ind;
  std::
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ::reserve(&local_78,
            ((long)(this->members_).
                   super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->members_).
                   super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  p = (this->members_).
      super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pmVar1 = (this->members_).
           super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (p == pmVar1) {
    local_d8 = (wchar_t *)0x1;
  }
  else {
    local_d8 = (wchar_t *)0x0;
    do {
      local_a8 = (wchar_t *)property_length<wchar_t>(&p->property);
      if (local_d8 <= local_a8) {
        local_d8 = local_a8;
      }
      property((object *)local_c8,&p->property);
      std::
      vector<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>,std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>>>
      ::
      emplace_back<std::shared_ptr<pstore::dump::string>,std::shared_ptr<pstore::dump::value>const&,unsigned_long_const&>
                ((vector<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>,std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>,unsigned_long>>>
                  *)&local_78,(shared_ptr<pstore::dump::string> *)local_c8,&p->val,
                 (unsigned_long *)&local_a8);
      if ((pointer)local_c8._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      p = p + 1;
    } while (p != pmVar1);
    local_d8 = (wchar_t *)((long)local_d8 + 1);
  }
  local_c8._0_8_ = local_c8 + 0x10;
  local_c8._8_8_ = (pointer)0x0;
  local_c8._16_4_ = 0;
  local_dc = local_88->count_ + 4;
  local_58 = local_78.
             super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_78.
      super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ptVar9 = local_78.
             super__Vector_base<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80 = strings;
    do {
      uVar2 = (ptVar9->
              super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
              ).super__Tuple_impl<1UL,_std::shared_ptr<pstore::dump::value>,_unsigned_long>.
              super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
              _M_head_impl;
      iVar4 = (int)local_d8;
      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (local_d0,(wchar_t *)local_c8._0_8_,local_c8._8_8_);
      peVar3 = (ptVar9->
               super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
               ).super__Head_base<0UL,_std::shared_ptr<pstore::dump::value>,_false>._M_head_impl.
               super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar3->_vptr_value[0x14])(peVar3,pwVar5);
      local_a8 = (wchar_t *)local_98;
      std::__cxx11::wstring::_M_construct((ulong)&local_a8,iVar4 - (int)uVar2);
      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar5,local_a8,local_a0);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (pwVar5,(strings->colon_space_str)._M_dataplus._M_p,
                 (strings->colon_space_str)._M_string_length);
      if (local_a8 != (wchar_t *)local_98) {
        operator_delete(local_a8,local_98[0] * 4 + 4);
      }
      peVar3 = (ptVar9->
               super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
               ).super__Tuple_impl<1UL,_std::shared_ptr<pstore::dump::value>,_unsigned_long>.
               super__Head_base<1UL,_std::shared_ptr<pstore::dump::value>,_false>._M_head_impl.
               super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = (ptVar9->
                super__Tuple_impl<0UL,_std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>
                ).super__Tuple_impl<1UL,_std::shared_ptr<pstore::dump::value>,_unsigned_long>.
                super__Head_base<1UL,_std::shared_ptr<pstore::dump::value>,_false>._M_head_impl.
                super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            goto LAB_0019b24f;
          }
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
LAB_0019b24f:
      iVar4 = (*peVar3->_vptr_value[2])(peVar3);
      if (CONCAT44(extraout_var,iVar4) == 0) {
        bVar7 = 0;
      }
      else {
        bVar7 = *(byte *)(CONCAT44(extraout_var,iVar4) + 0x20) ^ 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if (bVar7 != 0) {
        pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (local_d0,(local_80->cr_str)._M_dataplus._M_p,
                            (local_80->cr_str)._M_string_length);
        if (local_dc != 0) {
          uVar8 = 0;
          do {
            local_a8 = (wchar_t *)CONCAT44(local_a8._4_4_,0x20);
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar5,(wchar_t *)&local_a8,1);
            uVar8 = uVar8 + 1;
          } while (uVar8 < local_dc);
        }
      }
      (*peVar3->_vptr_value[0x16])(peVar3,local_d0,&local_dc);
      local_50[0] = local_40;
      std::__cxx11::wstring::_M_construct((ulong)local_50,local_88->count_);
      strings = local_80;
      pwVar6 = (wstring *)
               std::__cxx11::wstring::replace
                         ((ulong)local_50,0,(wchar_t *)0x0,
                          (ulong)(local_80->cr_str)._M_dataplus._M_p);
      std::__cxx11::wstring::wstring((wstring *)&local_a8,pwVar6);
      std::__cxx11::wstring::operator=((wstring *)local_c8,(wstring *)&local_a8);
      if (local_a8 != (wchar_t *)local_98) {
        operator_delete(local_a8,local_98[0] * 4 + 4);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] * 4 + 4);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      ptVar9 = ptVar9 + 1;
    } while (ptVar9 != local_58);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,CONCAT44(local_c8._20_4_,local_c8._16_4_) * 4 + 4);
    }
  }
  std::
  vector<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>,_std::allocator<std::tuple<std::shared_ptr<pstore::dump::value>,_std::shared_ptr<pstore::dump::value>,_unsigned_long>_>_>
  ::~vector(&local_78);
  return local_d0;
}

Assistant:

OStream &
        object::write_full_size (OStream & os, indent const & ind,
                                 object_strings<ObjectCharacterTraits> const & strings) const {
            using char_type = typename OStream::char_type;
            using string_type = std::basic_string<char_type>;

            // Proceed in two phases: the first measures the length of all of the object keys to
            // find the longest. This enables the values to be nicely aligned by inserting the
            // correct horizontal spacing.
            enum { key_index, value_index, key_length_index };
            std::vector<std::tuple<value_ptr, value_ptr, std::size_t>> kvps;
            kvps.reserve (members_.size ());

            auto longest = std::size_t{0};
            for (object::member const & kvp : members_) {
                std::size_t const key_length = object::property_length<char_type> (kvp.property);
                longest = std::max (longest, key_length);
                kvps.emplace_back (object::property (kvp.property), kvp.val, key_length);
            }

            // The second phase: produce the keys and values with the correct number of spaces
            // between them.
            string_type sep;
            indent next_indent = ind.next (4);

            auto const needs_new_line = [] (value_ptr const value) {
                object const * const obj = value->dynamic_cast_object ();
                return obj != nullptr && !obj->is_compact ();
            };

            for (auto const & a : kvps) {
                std::size_t const num_spaces = longest - std::get<key_length_index> (a) + 1U;
                os << sep << (*std::get<key_index> (a))
                   << string_type (num_spaces, strings.space_str[0]) << strings.colon_space_str;

                // If the value is an object then we may need to insert a new line here.
                auto const value = std::get<value_index> (a);
                if (needs_new_line (value)) {
                    os << strings.cr_str << next_indent;
                }
                value->write_impl (os, next_indent);

                sep = strings.cr_str + ind.str<char_type> ();
            }
            return os;
        }